

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlCatalogPtrWrap(xmlCatalogPtr catal)

{
  PyObject *ret;
  xmlCatalogPtr catal_local;
  
  if (catal == (xmlCatalogPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    catal_local = (xmlCatalogPtr)&_Py_NoneStruct;
  }
  else {
    catal_local = (xmlCatalogPtr)PyCapsule_New(catal,"xmlCatalogPtr",0);
  }
  return (PyObject *)catal_local;
}

Assistant:

PyObject *
libxml_xmlCatalogPtrWrap(xmlCatalogPtr catal)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlNodePtrWrap: catal = %p\n", catal);
#endif
    if (catal == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) catal,
                                     (char *) "xmlCatalogPtr", NULL);
    return (ret);
}